

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcDebugGetReversedStackDataBase(uint framePos)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint unaff_R15D;
  
  uVar1 = nullcDebugGetStackFrameCount();
  iVar7 = uVar1 - framePos;
  uVar6 = 0;
  if (framePos <= uVar1) {
    uVar6 = 0;
    uVar1 = 0;
    do {
      uVar2 = nullcDebugEnumStackFrame(uVar1);
      if (uVar2 == 0) {
        iVar3 = 3;
      }
      else if (iVar7 == 0) {
        iVar3 = 1;
        iVar7 = 0;
        unaff_R15D = uVar6;
      }
      else {
        if (NULLC::linker == 0) {
          uVar8 = 0;
          lVar5 = 0;
        }
        else {
          uVar8 = (ulong)*(uint *)(NULLC::linker + 0x24c);
          lVar5 = *(long *)(NULLC::linker + 0x240);
        }
        if ((int)uVar8 != 0) {
          do {
            if ((*(int *)(lVar5 + 4) <= (int)uVar2) &&
               ((int)uVar2 < *(int *)(lVar5 + 4) + *(int *)(lVar5 + 8))) goto LAB_0010df52;
            lVar5 = lVar5 + 0x94;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        lVar5 = 0;
LAB_0010df52:
        iVar7 = iVar7 + -1;
        piVar4 = (int *)(NULLC::linker + 0x750);
        if (lVar5 != 0) {
          piVar4 = (int *)(lVar5 + 0x68);
        }
        uVar6 = uVar6 + (*piVar4 + 0xfU & 0xfffffff0);
        iVar3 = 0;
      }
      uVar1 = uVar1 + 1;
    } while (iVar3 == 0);
    if (iVar3 != 3) {
      uVar6 = unaff_R15D;
    }
  }
  return uVar6;
}

Assistant:

unsigned nullcDebugGetReversedStackDataBase(unsigned framePos)
{
	using namespace NULLC;

	unsigned callStackSize = nullcDebugGetStackFrameCount();

	if(framePos > callStackSize)
		return 0;

	unsigned targetFrame = callStackSize - framePos;

	unsigned offset = 0;

	unsigned currentFrame = 0;
	while(unsigned instruction = nullcDebugEnumStackFrame(currentFrame++))
	{
		if(targetFrame == 0)
			return offset;

		targetFrame--;

		unsigned functionCount = 0;
		ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

		if(ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount))
			offset += (targetFunction->stackSize + 0xf) & ~0xf;
		else
			offset += (linker->globalVarSize + 0xf) & ~0xf;
	}

	return offset;
}